

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

Curl_easy * Curl_multi_get_easy(Curl_multi *multi,uint mid)

{
  curl_trc_feat *pcVar1;
  Curl_easy *pCVar2;
  
  if (((mid != 0) &&
      (pCVar2 = (Curl_easy *)Curl_uint_tbl_get(&multi->xfers,mid), pCVar2 != (Curl_easy *)0x0)) &&
     (pCVar2->magic == 0xc0dedbad)) {
    return pCVar2;
  }
  pCVar2 = multi->admin;
  if ((((pCVar2 != (Curl_easy *)0x0) && (((pCVar2->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar1 = (pCVar2->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
     && (0 < Curl_trc_feat_multi.log_level)) {
    Curl_trc_multi(pCVar2,"invalid easy handle in xfer table for mid=%u",mid);
  }
  Curl_uint_tbl_remove(&multi->xfers,mid);
  return (Curl_easy *)0x0;
}

Assistant:

struct Curl_easy *Curl_multi_get_easy(struct Curl_multi *multi,
                                      unsigned int mid)
{
  struct Curl_easy *data = mid ? Curl_uint_tbl_get(&multi->xfers, mid) : NULL;
  if(data && GOOD_EASY_HANDLE(data))
    return data;
  CURL_TRC_M(multi->admin, "invalid easy handle in xfer table for mid=%u",
             mid);
  Curl_uint_tbl_remove(&multi->xfers, mid);
  return NULL;
}